

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-dump.c
# Opt level: O3

char * fy_simple_key_list_dump_format
                 (fy_parser *fyp,fy_simple_key_list *fyskl,fy_simple_key *fysk_highlight,char *buf,
                 size_t bufsz)

{
  fy_simple_key *pfVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  fy_simple_key *pfVar5;
  fy_parser *__s;
  fy_parser *fyp_00;
  char *pcVar6;
  fy_simple_key *fysk;
  
  __s = (fy_parser *)buf;
  if (fyskl != (fy_simple_key_list *)0x0) {
    fysk = (fy_simple_key *)(fyskl->_lh).next;
    if (fysk != (fy_simple_key *)0x0 && fysk != (fy_simple_key *)fyskl) {
      do {
        pfVar1 = (fy_simple_key *)(fyskl->_lh).next;
        pfVar5 = (fy_simple_key *)0x0;
        if (pfVar1 != (fy_simple_key *)fyskl) {
          pfVar5 = pfVar1;
        }
        pcVar4 = "";
        if (fysk != pfVar5) {
          pcVar4 = ",";
        }
        pcVar6 = "*";
        if (fysk != fysk_highlight) {
          pcVar6 = "";
        }
        fyp_00 = __s;
        iVar2 = snprintf((char *)__s,(size_t)(buf + ((bufsz - 1) - (long)__s)),"%s%s",pcVar4,pcVar6)
        ;
        pcVar4 = (char *)((long)&(__s->cfg).search_path + (long)iVar2);
        fy_simple_key_dump_format(fyp_00,fysk,pcVar4,(size_t)(buf + ((bufsz - 1) - (long)pcVar4)));
        sVar3 = strlen(pcVar4);
        __s = (fy_parser *)(pcVar4 + sVar3);
        fysk = (fy_simple_key *)(fysk->node).next;
      } while ((fysk != (fy_simple_key *)fyskl) && (fysk != (fy_simple_key *)0x0));
    }
  }
  *(char *)&(__s->cfg).search_path = '\0';
  return buf;
}

Assistant:

char *fy_simple_key_list_dump_format(struct fy_parser *fyp, struct fy_simple_key_list *fyskl,
                                     struct fy_simple_key *fysk_highlight, char *buf, size_t bufsz) {
    char *s, *e;
    struct fy_simple_key *fysk;

    s = buf;
    e = buf + bufsz - 1;
    for (fysk = fy_simple_key_list_first(fyskl); fysk; fysk = fy_simple_key_next(fyskl, fysk)) {

        s += snprintf(s, e - s, "%s%s",
                      fysk != fy_simple_key_list_first(fyskl) ? "," : "",
                      fysk_highlight == fysk ? "*" : "");

        fy_simple_key_dump_format(fyp, fysk, s, e - s);

        s += strlen(s);
    }
    *s = '\0';

    return buf;
}